

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O0

bool isReachable(BasicBlock *basicBlock)

{
  int iVar1;
  BasicBlock *pBVar2;
  BasicBlock *in_RDI;
  BasicBlock *unaff_retaddr;
  undefined1 local_9;
  
  iVar1 = predecessorsNumber(unaff_retaddr);
  local_9 = true;
  if (iVar1 < 1) {
    llvm::BasicBlock::getParent(in_RDI);
    pBVar2 = llvm::Function::front((Function *)0x1939d2);
    local_9 = pBVar2 == in_RDI;
  }
  return local_9;
}

Assistant:

bool isReachable(const BasicBlock *basicBlock) {
    return predecessorsNumber(basicBlock) > 0 ||
           &basicBlock->getParent()->front() == basicBlock;
}